

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O2

void __thiscall CLogger::Warn<int&,char*&>(CLogger *this,string_view fmt,int *args,char **args_1)

{
  format_string_t<int_&,_char_*&> fmt_00;
  logger *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  spdlog::get((char *)&local_38);
  fmt_00.str_.size_ = fmt._M_len;
  fmt_00.str_.data_ = fmt._M_str;
  spdlog::logger::warn<int&,char*&>(local_38,fmt_00,args,args_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void Warn(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->warn(fmt, std::forward<Args>(args)...);
	}